

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleighbase.cc
# Opt level: O0

void __thiscall SleighBase::saveXml(SleighBase *this,ostream *s)

{
  int iVar1;
  ostream *poVar2;
  bool val;
  uintm uVar3;
  int4 iVar4;
  spacetype sVar5;
  AddrSpace *pAVar6;
  string *val_00;
  AddrSpace *spc;
  int4 i;
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  SleighBase *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  std::operator<<(s,"<sleigh");
  poVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"version",&local_39);
  a_v_i(poVar2,(string *)local_38,2);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  poVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"bigendian",&local_71);
  val = Translate::isBigEndian(&this->super_Translate);
  a_v_b(poVar2,(string *)local_70,val);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  poVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"align",&local_99);
  a_v_i(poVar2,(string *)local_98,(long)(this->super_Translate).alignment);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  poVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"uniqbase",&local_c1);
  uVar3 = Translate::getUniqueBase(&this->super_Translate);
  a_v_u(poVar2,(string *)local_c0,(ulong)uVar3);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  poVar2 = local_18;
  if (this->maxdelayslotbytes != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"maxdelay",&local_e9);
    a_v_u(poVar2,(string *)local_e8,(ulong)this->maxdelayslotbytes);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  poVar2 = local_18;
  if (this->unique_allocatemask != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"uniqmask",&local_111);
    a_v_u(poVar2,(string *)local_110,(ulong)this->unique_allocatemask);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  poVar2 = local_18;
  if (this->numSections != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"numsections",&local_139);
    a_v_u(poVar2,(string *)local_138,(ulong)this->numSections);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  std::operator<<(local_18,">\n");
  std::operator<<(local_18,"<spaces");
  poVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"defaultspace",(allocator *)((long)&spc + 7));
  pAVar6 = AddrSpaceManager::getDefaultSpace((AddrSpaceManager *)this);
  val_00 = AddrSpace::getName_abi_cxx11_(pAVar6);
  a_v(poVar2,(string *)&i,val_00);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&spc + 7));
  std::operator<<(local_18,">\n");
  for (spc._0_4_ = 0; iVar1 = (int)spc,
      iVar4 = AddrSpaceManager::numSpaces((AddrSpaceManager *)this), iVar1 < iVar4;
      spc._0_4_ = (int)spc + 1) {
    pAVar6 = AddrSpaceManager::getSpace((AddrSpaceManager *)this,(int)spc);
    if ((((pAVar6 != (AddrSpace *)0x0) &&
         (sVar5 = AddrSpace::getType(pAVar6), sVar5 != IPTR_CONSTANT)) &&
        (sVar5 = AddrSpace::getType(pAVar6), sVar5 != IPTR_FSPEC)) &&
       ((sVar5 = AddrSpace::getType(pAVar6), sVar5 != IPTR_IOP &&
        (sVar5 = AddrSpace::getType(pAVar6), sVar5 != IPTR_JOIN)))) {
      (*pAVar6->_vptr_AddrSpace[0xc])(pAVar6,local_18);
    }
  }
  std::operator<<(local_18,"</spaces>\n");
  SymbolTable::saveXml(&this->symtab,local_18);
  std::operator<<(local_18,"</sleigh>\n");
  return;
}

Assistant:

void SleighBase::saveXml(ostream &s) const

{
  s << "<sleigh";
  a_v_i(s,"version",SLA_FORMAT_VERSION);
  a_v_b(s,"bigendian",isBigEndian());
  a_v_i(s,"align",alignment);
  a_v_u(s,"uniqbase",getUniqueBase());
  if (maxdelayslotbytes > 0)
    a_v_u(s,"maxdelay",maxdelayslotbytes);
  if (unique_allocatemask != 0)
    a_v_u(s,"uniqmask",unique_allocatemask);
  if (numSections != 0)
    a_v_u(s,"numsections",numSections);
  s << ">\n";

  s << "<spaces";
  a_v(s,"defaultspace",getDefaultSpace()->getName());
  s << ">\n";
  for(int4 i=0;i<numSpaces();++i) {
    AddrSpace *spc = getSpace(i);
    if (spc == (AddrSpace *)0) continue;
    if ((spc->getType()==IPTR_CONSTANT) || 
	(spc->getType()==IPTR_FSPEC)||
	(spc->getType()==IPTR_IOP)||
	(spc->getType()==IPTR_JOIN))
      continue;
    spc->saveXml(s);
  }
  s << "</spaces>\n";
  symtab.saveXml(s);
  s << "</sleigh>\n";
}